

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tqapi_cs.h
# Opt level: O0

void __thiscall AccountInfoWrap::AccountInfoWrap(AccountInfoWrap *this,AccountInfoWrap *rhs)

{
  char *pcVar1;
  AccountInfoWrap *rhs_local;
  AccountInfoWrap *this_local;
  
  tquant::api::AccountInfo::AccountInfo(&this->m_orig);
  tquant::api::AccountInfo::operator=(&this->m_orig,&rhs->m_orig);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  this->account_id = pcVar1;
  pcVar1 = (char *)std::__cxx11::string::c_str();
  this->broker = pcVar1;
  pcVar1 = (char *)std::__cxx11::string::c_str();
  this->account = pcVar1;
  pcVar1 = (char *)std::__cxx11::string::c_str();
  this->status = pcVar1;
  pcVar1 = (char *)std::__cxx11::string::c_str();
  this->msg = pcVar1;
  pcVar1 = (char *)std::__cxx11::string::c_str();
  this->account_type = pcVar1;
  return;
}

Assistant:

AccountInfoWrap(const AccountInfoWrap& rhs)
	{
		m_orig = rhs.m_orig;
        account_id   = m_orig.account_id  .c_str();
        broker       = m_orig.broker      .c_str();
        account      = m_orig.account     .c_str();
        status       = m_orig.status      .c_str();
        msg          = m_orig.msg         .c_str();
        account_type = m_orig.account_type.c_str();
	}